

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool ON_String::IsPossibleEncoding(Encoding encoding,char *buffer,int buffer_length)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  undefined8 in_RAX;
  ulong uVar4;
  char *pcVar5;
  int extraout_EDX;
  ulong uVar6;
  ulong uVar7;
  int db_count;
  int iVar8;
  uint uVar9;
  undefined6 uStack_38;
  ON_Big5CodePoint big5_cp;
  
  if (buffer != (char *)0x0 && Unknown < encoding) {
    _uStack_38 = in_RAX;
    iVar8 = buffer_length;
    if (buffer_length == -1) {
      buffer_length = Length(buffer);
      iVar8 = extraout_EDX;
    }
    if (buffer_length == 0) {
      return true;
    }
    if (-1 < buffer_length) {
      switch(encoding) {
      case ASCII:
        uVar4 = (ulong)(uint)buffer_length;
        uVar6 = 0xffffffffffffffff;
        do {
          uVar7 = uVar4;
          if (uVar6 - uVar4 == -1) break;
          uVar7 = uVar6 + 1;
          lVar2 = uVar6 + 1;
          uVar6 = uVar7;
        } while (-1 < buffer[lVar2]);
        return uVar4 <= uVar7;
      case UTF8:
      case SloppyUTF8:
        bVar3 = ON_IsUTF8Encoded(SUB81(buffer,0),(char *)(ulong)(uint)buffer_length,iVar8);
        return bVar3;
      case BIG5andASCII:
        iVar8 = 0;
        for (uVar9 = 0; (int)uVar9 < buffer_length; uVar9 = iVar1 + uVar9) {
          if (buffer[uVar9] < '\0') {
            if (buffer_length < (int)(uVar9 + 2)) break;
            _uStack_38 = CONCAT26(ON_Big5CodePoint::Error.m_big5_code_point,uStack_38);
            pcVar5 = ON_Big5CodePoint::Decode(buffer + uVar9,2,false,false,&big5_cp);
            if ((pcVar5 != buffer + uVar9 + 2) ||
               (bVar3 = ON_Big5CodePoint::IsValid(&big5_cp,false,false), !bVar3)) break;
            iVar8 = iVar8 + 1;
            iVar1 = 2;
          }
          else {
            iVar1 = 1;
          }
        }
        return 0 < iVar8 && buffer_length <= (int)uVar9;
      }
    }
  }
  return false;
}

Assistant:

bool ON_String::IsPossibleEncoding(
  ON_String::Encoding encoding,
  const char* buffer,
  int buffer_length
)
{
  // In practice, this is used to choose between BIG5 and UTF when parsing strings that
  // are names of components.
  // 
  // If you need something more clever like NOTPOAD++ encoding detection, then you need
  // to find a library that uses some sampling and linguistic analysis.
  if (ON_String::Encoding::Unset == encoding)
    return false;
  if (ON_String::Encoding::Unknown == encoding)
    return false;
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (0 == buffer_length)
    return true;
  if (buffer_length < 0)
    return false;

  switch (encoding)
  {
  case ON_String::Encoding::ASCII:
    return ON_IsASCIIEncoded(buffer, buffer_length);
  case ON_String::Encoding::UTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  case ON_String::Encoding::BIG5andASCII:
    return ON_IsBig5Encoded(buffer, buffer_length);
  case ON_String::Encoding::SloppyUTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  default:
    break;
  }

  return false;
}